

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               ImGuiSliderFlags flags)

{
  bool bVar1;
  float *pfVar2;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  float in_EDI;
  undefined8 in_R8;
  uint in_R9D;
  float in_XMM0_Da;
  float rhs;
  float fVar3;
  undefined1 unaff_retaddr;
  uint unaff_retaddr_00;
  uint in_stack_00000008;
  float in_stack_0000000c;
  ImGuiDataType in_stack_00000010;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float v_old_ref_for_accum_remainder;
  uint v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_floating_point;
  bool is_logarithmic;
  bool is_clamped;
  ImGuiAxis axis;
  ImGuiContext *g;
  bool local_83;
  int in_stack_ffffffffffffff84;
  undefined3 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  float local_5c;
  uint local_58;
  ImVec2 local_50;
  int local_48;
  float local_44;
  undefined1 in_stack_ffffffffffffffc0;
  float fast_factor;
  ImGuiContext *pIVar5;
  undefined1 in_stack_ffffffffffffffd3;
  ImGuiDataType in_stack_ffffffffffffffe0;
  float local_14;
  float in_stack_fffffffffffffffc;
  
  fVar3 = (float)(uint)((in_R9D & 0x100000) != 0);
  uVar4 = CONCAT13(1,in_stack_ffffffffffffff88);
  if (in_EDI != 1.12104e-44) {
    uVar4 = CONCAT13(in_EDI == 1.26117e-44,in_stack_ffffffffffffff88);
  }
  fast_factor = (float)CONCAT22(CONCAT11(in_EDX < in_ECX,(in_R9D & 0x20) != 0),
                                CONCAT11((char)((uint)uVar4 >> 0x18),in_stack_ffffffffffffffc0));
  local_14 = in_XMM0_Da;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && (in_EDX < in_ECX)) &&
     ((float)(in_ECX - in_EDX) < 3.4028235e+38)) {
    local_14 = (float)(in_ECX - in_EDX) * GImGui->DragSpeedDefaultRatio;
  }
  local_44 = 0.0;
  pIVar5 = GImGui;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar1 = IsMousePosValid((ImVec2 *)0x0), bVar1)) &&
     (bVar1 = IsMouseDragPastThreshold(0,(pIVar5->IO).MouseDragThreshold * 0.5), bVar1)) {
    pfVar2 = ImVec2::operator[](&(pIVar5->IO).MouseDelta,(long)(int)fVar3);
    local_44 = *pfVar2;
    if (((pIVar5->IO).KeyAlt & 1U) != 0) {
      local_44 = local_44 * 0.01;
    }
    if (((pIVar5->IO).KeyShift & 1U) != 0) {
      local_44 = local_44 * 10.0;
    }
  }
  else if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
    if (((uint)fast_factor & 0x100) == 0) {
      in_stack_ffffffffffffff84 = 0;
    }
    else {
      in_stack_ffffffffffffff84 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),in_stack_ffffffffffffff84);
    }
    local_48 = in_stack_ffffffffffffff84;
    local_50 = GetNavInputAmount2d((ImGuiNavDirSourceFlags)((ulong)pIVar5 >> 0x20),
                                   (ImGuiInputReadMode)pIVar5,fVar3,fast_factor);
    pfVar2 = ImVec2::operator[](&local_50,(long)(int)fVar3);
    local_44 = *pfVar2;
    rhs = GetMinimumStepAtDecimalPrecision((int)local_14);
    local_14 = ImMax<float>(local_14,rhs);
  }
  local_44 = local_14 * local_44;
  if (fVar3 == 1.4013e-45) {
    local_44 = -local_44;
  }
  if (((((uint)fast_factor & 0x10000) != 0) && ((float)(in_ECX - in_EDX) < 3.4028235e+38)) &&
     (1e-06 < (float)(in_ECX - in_EDX))) {
    local_44 = local_44 / (float)(in_ECX - in_EDX);
  }
  local_83 = false;
  if ((((uint)fast_factor & 0x1000000) != 0) &&
     ((*in_RSI < in_ECX || (local_83 = true, local_44 <= 0.0)))) {
    local_83 = *in_RSI <= in_EDX && local_44 < 0.0;
  }
  if (((pIVar5->ActiveIdIsJustActivated & 1U) != 0) || (local_83)) {
    pIVar5->DragCurrentAccum = 0.0;
    pIVar5->DragCurrentAccumDirty = false;
  }
  else if ((local_44 != 0.0) || (NAN(local_44))) {
    pIVar5->DragCurrentAccum = local_44 + pIVar5->DragCurrentAccum;
    pIVar5->DragCurrentAccumDirty = true;
  }
  if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
    bVar1 = false;
  }
  else {
    local_5c = 0.0;
    if (((uint)fast_factor & 0x10000) == 0) {
      local_58 = (int)pIVar5->DragCurrentAccum + *in_RSI;
    }
    else {
      if (((uint)fast_factor & 0x100) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff8c,uVar4),in_stack_ffffffffffffff84);
      }
      ImPow(0.0,2.554427e-39);
      local_5c = ScaleRatioFromValueT<unsigned_int,int,float>
                           (in_stack_ffffffffffffffe0,(uint)((ulong)in_R8 >> 0x20),(uint)in_R8,
                            in_R9D,(bool)in_stack_ffffffffffffffd3,(float)((ulong)pIVar5 >> 0x20),
                            SUB84(pIVar5,0));
      local_58 = ScaleValueFromRatioT<unsigned_int,int,float>
                           (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            (bool)unaff_retaddr,in_stack_fffffffffffffffc,in_EDI);
    }
    if ((in_R9D & 0x40) == 0) {
      local_58 = RoundScalarWithFormatT<unsigned_int,int>
                           ((char *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                            (ImGuiDataType)((ulong)in_RSI >> 0x20),(uint)in_RSI);
    }
    pIVar5->DragCurrentAccumDirty = false;
    if (((uint)fast_factor & 0x10000) == 0) {
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(int)(local_58 - *in_RSI);
    }
    else {
      fVar3 = ScaleRatioFromValueT<unsigned_int,int,float>
                        (in_stack_ffffffffffffffe0,(uint)((ulong)in_R8 >> 0x20),(uint)in_R8,in_R9D,
                         (bool)in_stack_ffffffffffffffd3,(float)((ulong)pIVar5 >> 0x20),
                         SUB84(pIVar5,0));
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (fVar3 - local_5c);
    }
    if (local_58 == 0) {
      local_58 = 0;
    }
    if ((*in_RSI != local_58) && (((uint)fast_factor & 0x1000000) != 0)) {
      if ((local_58 < in_EDX) ||
         (((*in_RSI < local_58 && (local_44 < 0.0)) && (((uint)fast_factor & 0x100) == 0)))) {
        local_58 = in_EDX;
      }
      if ((in_ECX < local_58) ||
         (((local_58 < *in_RSI && (0.0 < local_44)) && (((uint)fast_factor & 0x100) == 0)))) {
        local_58 = in_ECX;
      }
    }
    if (*in_RSI == local_58) {
      bVar1 = false;
    }
    else {
      *in_RSI = local_58;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}